

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void POOL_add_internal(POOL_ctx *ctx,POOL_function function,void *opaque)

{
  POOL_job *pPVar1;
  size_t sVar2;
  
  if (ctx->shutdown != 0) {
    return;
  }
  ctx->queueEmpty = 0;
  pPVar1 = ctx->queue;
  sVar2 = ctx->queueTail;
  pPVar1[sVar2].function = function;
  pPVar1[sVar2].opaque = opaque;
  ctx->queueTail = (sVar2 + 1) % ctx->queueSize;
  pthread_cond_signal((pthread_cond_t *)&ctx->queuePopCond);
  return;
}

Assistant:

static void
POOL_add_internal(POOL_ctx* ctx, POOL_function function, void *opaque)
{
    POOL_job job;
    job.function = function;
    job.opaque = opaque;
    assert(ctx != NULL);
    if (ctx->shutdown) return;

    ctx->queueEmpty = 0;
    ctx->queue[ctx->queueTail] = job;
    ctx->queueTail = (ctx->queueTail + 1) % ctx->queueSize;
    ZSTD_pthread_cond_signal(&ctx->queuePopCond);
}